

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2R.cpp
# Opt level: O1

void __thiscall
OpenMD::P2R::P2R(P2R *this,SimInfo *info,string *filename,string *sele1,string *sele2,uint nbins)

{
  SelectionEvaluator *this_00;
  SelectionEvaluator *this_01;
  pointer pOVar1;
  pointer pcVar2;
  long *plVar3;
  pointer pOVar4;
  long lVar5;
  string paramString;
  stringstream params;
  string local_1f8;
  SelectionManager *local_1d8;
  SelectionManager *local_1d0;
  string *local_1c8;
  string *local_1c0;
  undefined1 local_1b8 [24];
  long lStack_1a0;
  ios_base local_138 [264];
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__P2R_0033af60;
  this->doVect_ = false;
  this->doOffset_ = false;
  (this->selectionScript1_)._M_dataplus._M_p = (pointer)&(this->selectionScript1_).field_2;
  pcVar2 = (sele1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript1_,pcVar2,pcVar2 + sele1->_M_string_length);
  local_1c8 = &this->selectionScript2_;
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)&(this->selectionScript2_).field_2;
  pcVar2 = (sele2->_M_dataplus)._M_p;
  local_1c0 = &this->selectionScript1_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,pcVar2,pcVar2 + sele2->_M_string_length);
  local_1d0 = &this->seleMan1_;
  SelectionManager::SelectionManager(local_1d0,info);
  local_1d8 = &this->seleMan2_;
  SelectionManager::SelectionManager(local_1d8,info);
  this_00 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  this_01 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(this_01,info);
  this->seleOffset_ = 0;
  this->seleOffset2_ = 0;
  this->nProcessed_ = 0;
  this->P2_ = 0.0;
  this->count_ = 0;
  SelectionEvaluator::loadScriptString(this_00,sele1);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_1b8,this_00);
    lVar5 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan1_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar5),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_1b8._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar5));
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_1b8);
  }
  SelectionEvaluator::loadScriptString(this_01,sele2);
  if ((this->evaluator2_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_1b8,this_01);
    lVar5 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan2_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar5),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_1b8._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar5));
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_1b8);
  }
  pOVar1 = (pointer)(local_1b8 + 0x10);
  local_1b8._0_8_ = pOVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,
             "2nd order Legendre Polynomial Correlation using r as reference axis","");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).analysisType_);
  if ((pointer)local_1b8._0_8_ != pOVar1) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)local_1b8._16_8_)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  getPrefix(&local_1f8,filename);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  pOVar4 = (pointer)(plVar3 + 2);
  if ((pointer)*plVar3 == pOVar4) {
    local_1b8._16_8_ =
         (pOVar4->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lStack_1a0 = plVar3[3];
    local_1b8._0_8_ = pOVar1;
  }
  else {
    local_1b8._16_8_ =
         (pOVar4->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_1b8._0_8_ = (pointer)*plVar3;
  }
  local_1b8._8_8_ = plVar3[1];
  *plVar3 = (long)pOVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((pointer)local_1b8._0_8_ != pOVar1) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)local_1b8._16_8_)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).paramString_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

P2R::P2R(SimInfo* info, const std::string& filename, const std::string& sele1,
           const std::string& sele2, unsigned int nbins) :
      StaticAnalyser(info, filename, nbins),
      doVect_(false), doOffset_(false), selectionScript1_(sele1),
      selectionScript2_(sele2), seleMan1_(info), seleMan2_(info),
      evaluator1_(info), evaluator2_(info) {
    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }

    setAnalysisType(
        "2nd order Legendre Polynomial Correlation using r as reference axis");
    setOutputName(getPrefix(filename) + ".P2R");
    std::stringstream params;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }